

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimePatternGenerator::DateTimePatternGenerator
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  FormatParser *this_00;
  DateTimeMatcher *this_01;
  DistanceInfo *this_02;
  PatternMap *this_03;
  DateTimePatternGenerator *size;
  PatternMap *local_108;
  DistanceInfo *local_f8;
  DateTimeMatcher *local_e8;
  FormatParser *local_d8;
  UnicodeString *local_a0;
  UnicodeString *local_80;
  DateTimePatternGenerator *other_local;
  DateTimePatternGenerator *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  size = other;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimePatternGenerator_005bd560;
  Locale::Locale(&this->pLocale);
  local_80 = (UnicodeString *)&this->field_0x108;
  do {
    icu_63::UnicodeString::UnicodeString(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != (UnicodeString *)&this->field_0x508);
  local_a0 = (UnicodeString *)&this->field_0x508;
  do {
    icu_63::UnicodeString::UnicodeString(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != &this->dateTimeFormat);
  icu_63::UnicodeString::UnicodeString(&this->dateTimeFormat);
  icu_63::UnicodeString::UnicodeString(&this->decimal);
  this->skipMatcher = (DateTimeMatcher *)0x0;
  this->fAvailableFormatKeyHash = (Hashtable *)0x0;
  icu_63::UnicodeString::UnicodeString(&this->emptyString);
  this->internalErrorCode = U_ZERO_ERROR;
  this_00 = (FormatParser *)UMemory::operator_new((UMemory *)0xc90,(size_t)size);
  local_d8 = (FormatParser *)0x0;
  if (this_00 != (FormatParser *)0x0) {
    FormatParser::FormatParser(this_00);
    local_d8 = this_00;
  }
  this->fp = local_d8;
  this_01 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)size);
  local_e8 = (DateTimeMatcher *)0x0;
  if (this_01 != (DateTimeMatcher *)0x0) {
    DateTimeMatcher::DateTimeMatcher(this_01);
    local_e8 = this_01;
  }
  this->dtMatcher = local_e8;
  this_02 = (DistanceInfo *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
  local_f8 = (DistanceInfo *)0x0;
  if (this_02 != (DistanceInfo *)0x0) {
    DistanceInfo::DistanceInfo(this_02);
    local_f8 = this_02;
  }
  this->distanceInfo = local_f8;
  this_03 = (PatternMap *)UMemory::operator_new((UMemory *)0x1b0,(size_t)size);
  local_108 = (PatternMap *)0x0;
  if (this_03 != (PatternMap *)0x0) {
    PatternMap::PatternMap(this_03);
    local_108 = this_03;
  }
  this->patternMap = local_108;
  if ((((this->fp == (FormatParser *)0x0) || (this->dtMatcher == (DateTimeMatcher *)0x0)) ||
      (this->distanceInfo == (DistanceInfo *)0x0)) || (this->patternMap == (PatternMap *)0x0)) {
    this->internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  operator=(this,other);
  return;
}

Assistant:

DateTimePatternGenerator::DateTimePatternGenerator(const DateTimePatternGenerator& other) :
    UObject(),
    skipMatcher(nullptr),
    fAvailableFormatKeyHash(nullptr),
    internalErrorCode(U_ZERO_ERROR)
{
    fp = new FormatParser();
    dtMatcher = new DateTimeMatcher();
    distanceInfo = new DistanceInfo();
    patternMap = new PatternMap();
    if (fp == nullptr || dtMatcher == nullptr || distanceInfo == nullptr || patternMap == nullptr) {
        internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    *this=other;
}